

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O2

void acmod_grow_feat_buf(acmod_t *acmod,int nfr)

{
  mfcc_t ***pppmVar1;
  long *plVar2;
  
  pppmVar1 = feat_array_realloc(acmod->fcb,acmod->feat_buf,acmod->n_feat_alloc,nfr);
  acmod->feat_buf = pppmVar1;
  plVar2 = (long *)__ckd_realloc__(acmod->framepos,(long)nfr * 8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                   ,0x186);
  acmod->framepos = plVar2;
  acmod->n_feat_alloc = nfr;
  return;
}

Assistant:

void
acmod_grow_feat_buf(acmod_t *acmod, int nfr)
{
    if (nfr > MAX_N_FRAMES)
        E_FATAL("Decoder can not process more than %d frames at once, "
                "requested %d\n", MAX_N_FRAMES, nfr);

    acmod->feat_buf = feat_array_realloc(acmod->fcb, acmod->feat_buf,
                                         acmod->n_feat_alloc, nfr);
    acmod->framepos = ckd_realloc(acmod->framepos,
                                  nfr * sizeof(*acmod->framepos));
    acmod->n_feat_alloc = nfr;
}